

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sz_decompress_3d.cpp
# Opt level: O1

void prediction_and_decompression_2d_with_border_prediction<float>
               (DSize_2d *size,meanInfo<float> *mean_info,double precision,int intv_radius,
               float *reg_params,uchar *indicator,int *type,float *unpredictable_data_pos,
               float *dec_data)

{
  size_t sVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  size_t sVar7;
  ulong uVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  int iVar12;
  long lVar13;
  void *__s;
  long lVar14;
  size_t sVar15;
  long lVar16;
  size_t sVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  int iVar22;
  size_t __size;
  uchar *puVar23;
  void *pvVar24;
  int iVar25;
  float *pfVar26;
  float *pfVar27;
  float fVar28;
  int size_x;
  float *local_d8;
  uchar *local_90;
  
  local_d8 = dec_data;
  uVar6 = size->d2;
  lVar14 = uVar6 + 1;
  iVar4 = size->block_size;
  lVar13 = (long)iVar4;
  __size = (lVar13 + 1) * lVar14 * 4;
  __s = malloc(__size);
  memset(__s,0,__size);
  sVar7 = size->num_x;
  if (sVar7 != 0) {
    uVar8 = size->d1;
    sVar9 = size->num_y;
    sVar10 = size->dim0_offset;
    lVar2 = uVar6 * 4 + 4;
    sVar17 = 0;
    local_90 = indicator;
    do {
      if (sVar9 != 0) {
        iVar21 = (int)uVar8 - (int)sVar17 * iVar4;
        if ((sVar17 + 1) * lVar13 < uVar8) {
          iVar21 = iVar4;
        }
        sVar11 = size->dim0_offset;
        sVar15 = 0;
        puVar23 = local_90;
        pvVar24 = __s;
        pfVar26 = local_d8;
        do {
          sVar1 = sVar15 + 1;
          iVar12 = (int)uVar6 - (int)sVar15 * iVar4;
          if (sVar1 * lVar13 < uVar6) {
            iVar12 = iVar4;
          }
          lVar18 = (long)iVar12;
          if (*puVar23 == '\0') {
            if (0 < iVar21) {
              lVar19 = (long)pvVar24 + lVar14 * 4 + 4;
              lVar16 = (long)pvVar24 + 4;
              iVar22 = 0;
              pfVar27 = pfVar26;
              do {
                if (0 < iVar12) {
                  bVar3 = mean_info->use_mean;
                  lVar20 = 0;
                  iVar25 = iVar12;
                  do {
                    iVar5 = *(int *)((long)type + lVar20);
                    if (iVar5 == 1) {
                      if ((bVar3 & 1U) == 0) goto LAB_00106f0d;
                      fVar28 = mean_info->mean;
                    }
                    else if (iVar5 == 0) {
                      fVar28 = *unpredictable_data_pos;
                      unpredictable_data_pos = unpredictable_data_pos + 1;
                    }
                    else {
LAB_00106f0d:
                      fVar28 = (float)((double)((iVar5 - intv_radius) * 2) * precision +
                                      (double)((*(float *)(lVar19 + -4 + lVar20) +
                                               *(float *)(lVar16 + lVar20)) -
                                              *(float *)(lVar16 + -4 + lVar20)));
                    }
                    *(float *)((long)pfVar27 + lVar20) = fVar28;
                    *(float *)(lVar19 + lVar20) = fVar28;
                    lVar20 = lVar20 + 4;
                    iVar25 = iVar25 + -1;
                  } while (iVar25 != 0);
                  type = (int *)((long)type + lVar20);
                  pfVar27 = (float *)((long)pfVar27 + lVar20);
                }
                pfVar27 = pfVar27 + (sVar11 - lVar18);
                iVar22 = iVar22 + 1;
                lVar19 = lVar19 + lVar2;
                lVar16 = lVar16 + lVar2;
              } while (iVar22 != iVar21);
            }
          }
          else {
            if (0 < iVar21) {
              lVar16 = (long)pvVar24 + lVar14 * 4 + 4;
              iVar22 = 0;
              pfVar27 = pfVar26;
              do {
                if (0 < iVar12) {
                  lVar19 = 0;
                  lVar20 = 0;
                  do {
                    if (type[lVar20] == 0) {
                      fVar28 = *unpredictable_data_pos;
                      unpredictable_data_pos = unpredictable_data_pos + 1;
                    }
                    else {
                      fVar28 = (float)((double)((type[lVar20] - intv_radius) * 2) * precision +
                                      (double)(*reg_params * (float)iVar22 +
                                               (float)(int)lVar20 * reg_params[1] + reg_params[2]));
                    }
                    pfVar27[lVar20] = fVar28;
                    *(float *)(lVar16 + lVar20 * 4) = fVar28;
                    lVar20 = lVar20 + 1;
                    lVar19 = lVar19 + -4;
                  } while (iVar12 != (int)lVar20);
                  type = (int *)((long)type - lVar19);
                  pfVar27 = (float *)((long)pfVar27 - lVar19);
                }
                pfVar27 = pfVar27 + (sVar11 - lVar18);
                iVar22 = iVar22 + 1;
                lVar16 = lVar16 + lVar2;
              } while (iVar22 != iVar21);
            }
            reg_params = reg_params + 3;
          }
          pfVar26 = pfVar26 + lVar18;
          pvVar24 = (void *)((long)pvVar24 + lVar18 * 4);
          puVar23 = puVar23 + 1;
          sVar15 = sVar1;
        } while (sVar1 != sVar9);
        local_90 = local_90 + sVar9;
      }
      memcpy(__s,(void *)((long)__s + lVar14 * lVar13 * 4),lVar14 * 4);
      local_d8 = local_d8 + sVar10 * lVar13;
      sVar17 = sVar17 + 1;
    } while (sVar17 != sVar7);
  }
  free(__s);
  return;
}

Assistant:

void
prediction_and_decompression_2d_with_border_prediction(const DSize_2d& size, const meanInfo<T>& mean_info, double precision,
	int intv_radius, const float * reg_params, const unsigned char * indicator, 
	const int * type, const T * unpredictable_data_pos, T * dec_data){
	const int * type_pos = type;
	const unsigned char * indicator_pos = indicator;
	const float * reg_params_pos = reg_params;
	size_t buffer_dim0_offset = size.d2 + 1;
	T * pred_buffer = (T *) malloc((size.block_size+1)*(size.d2+1)*sizeof(T));
	memset(pred_buffer, 0, (size.block_size+1)*(size.d2+1)*sizeof(T));
	T * x_data_pos = dec_data;
	for(size_t i=0; i<size.num_x; i++){
		T * y_data_pos = x_data_pos;
		T * pred_buffer_pos = pred_buffer;
		for(size_t j=0; j<size.num_y; j++){
			int size_x = ((i+1)*size.block_size < size.d1) ? size.block_size : size.d1 - i*size.block_size;
			int size_y = ((j+1)*size.block_size < size.d2) ? size.block_size : size.d2 - j*size.block_size;
			if(*indicator_pos){
				// regression
				block_pred_and_decompress_regression_2d_with_buffer(reg_params_pos, pred_buffer_pos, precision, intv_radius, 
					size_x, size_y, buffer_dim0_offset, size.dim0_offset, type_pos, unpredictable_data_pos, y_data_pos);
				reg_params_pos += RegCoeffNum2d;
			}
			else{
				// Lorenzo
				block_pred_and_decompress_lorenzo_2d(mean_info, pred_buffer_pos, precision, intv_radius, size_x, size_y, 
						buffer_dim0_offset, size.dim0_offset, type_pos, unpredictable_data_pos, y_data_pos);
			}
			y_data_pos += size_y;
			pred_buffer_pos += size_y;
			indicator_pos ++;
		}
		memcpy(pred_buffer, pred_buffer + size.block_size*buffer_dim0_offset, buffer_dim0_offset*sizeof(T));
		x_data_pos += size.block_size*size.dim0_offset;
	}
	free(pred_buffer);
}